

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O2

size_t __thiscall VMScriptFunction::PropagateMark(VMScriptFunction *this)

{
  byte bVar1;
  size_t sVar2;
  FVoidObj *pFVar3;
  FVoidObj *konsta;
  FVoidObj *obj;
  int count;
  ulong uVar4;
  
  obj = this->KonstA;
  if (obj != (FVoidObj *)0x0) {
    uVar4 = (ulong)this->NumKonstA;
    pFVar3 = obj + uVar4;
    for (; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
      if (*(char *)pFVar3 == '\x01') {
        GC::Mark<DObject>(&obj->o);
      }
      pFVar3 = (FVoidObj *)((long)pFVar3 + 1);
      obj = obj + 1;
    }
  }
  bVar1 = this->NumKonstA;
  sVar2 = DObject::PropagateMark((DObject *)this);
  return sVar2 + (ulong)bVar1 * 8;
}

Assistant:

size_t VMScriptFunction::PropagateMark()
{
	if (KonstA != NULL)
	{
		FVoidObj *konsta = KonstA;
		VM_UBYTE *atag = KonstATags();
		for (int count = NumKonstA; count > 0; --count)
		{
			if (*atag++ == ATAG_OBJECT)
			{
				GC::Mark(konsta->o);
			}
			konsta++;
		}
	}
	return NumKonstA * sizeof(void *) + Super::PropagateMark();
}